

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_create_schema.cpp
# Opt level: O1

unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true> __thiscall
duckdb::Transformer::TransformCreateSchema(Transformer *this,PGCreateSchemaStmt *stmt)

{
  char *pcVar1;
  undefined8 *puVar2;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> _Var3;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> _Var4;
  OnCreateConflict OVar5;
  Transformer *pTVar6;
  CreateInfo *this_00;
  pointer pCVar7;
  pointer pCVar8;
  NotImplementedException *this_01;
  long in_RDX;
  pointer *__ptr;
  char *pcVar9;
  templated_unique_single_t info;
  optional_ptr<duckdb_libpgquery::PGNode,_true> node;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_60;
  string local_58;
  optional_ptr<duckdb_libpgquery::PGNode,_true> local_38;
  
  pTVar6 = (Transformer *)operator_new(0x80);
  CreateStatement::CreateStatement((CreateStatement *)pTVar6);
  (this->parent).ptr = pTVar6;
  this_00 = (CreateInfo *)operator_new(0x128);
  CreateSchemaInfo::CreateSchemaInfo((CreateSchemaInfo *)this_00);
  pcVar1 = *(char **)(in_RDX + 8);
  local_60._M_head_impl = this_00;
  pCVar7 = unique_ptr<duckdb::CreateSchemaInfo,_std::default_delete<duckdb::CreateSchemaInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSchemaInfo,_std::default_delete<duckdb::CreateSchemaInfo>,_true>
                         *)&local_60);
  pcVar9 = anon_var_dwarf_647c332 + 9;
  if (pcVar1 != (char *)0x0) {
    pcVar9 = pcVar1;
  }
  pcVar1 = (char *)(pCVar7->super_CreateInfo).catalog._M_string_length;
  strlen(pcVar9);
  ::std::__cxx11::string::_M_replace
            ((ulong)&(pCVar7->super_CreateInfo).catalog,0,pcVar1,(ulong)pcVar9);
  pcVar1 = *(char **)(in_RDX + 0x10);
  pCVar7 = unique_ptr<duckdb::CreateSchemaInfo,_std::default_delete<duckdb::CreateSchemaInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSchemaInfo,_std::default_delete<duckdb::CreateSchemaInfo>,_true>
                         *)&local_60);
  pTVar6 = (Transformer *)&(pCVar7->super_CreateInfo).schema;
  pcVar9 = (char *)(pCVar7->super_CreateInfo).schema._M_string_length;
  strlen(pcVar1);
  ::std::__cxx11::string::_M_replace((ulong)pTVar6,0,pcVar9,(ulong)pcVar1);
  OVar5 = TransformOnConflict(pTVar6,*(PGOnCreateConflict *)(in_RDX + 0x20));
  pCVar7 = unique_ptr<duckdb::CreateSchemaInfo,_std::default_delete<duckdb::CreateSchemaInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSchemaInfo,_std::default_delete<duckdb::CreateSchemaInfo>,_true>
                         *)&local_60);
  _Var4._M_head_impl = local_60._M_head_impl;
  (pCVar7->super_CreateInfo).on_conflict = OVar5;
  if ((*(long *)(in_RDX + 0x18) != 0) &&
     (puVar2 = *(undefined8 **)(*(long *)(in_RDX + 0x18) + 8), puVar2 != (undefined8 *)0x0)) {
    local_38.ptr = (PGNode *)*puVar2;
    optional_ptr<duckdb_libpgquery::PGNode,_true>::CheckValid(&local_38);
    this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Schema element not supported yet!","");
    NotImplementedException::NotImplementedException(this_01,&local_58);
    __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_60._M_head_impl = (CreateInfo *)0x0;
  pCVar8 = unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true>::
           operator->((unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true>
                       *)this);
  _Var3._M_head_impl =
       (pCVar8->info).super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>
       ._M_t.super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
       super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
  (pCVar8->info).super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t
  .super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
  super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var3._M_head_impl != (CreateInfo *)0x0) {
    (**(code **)(*(long *)&(_Var3._M_head_impl)->super_ParseInfo + 8))();
  }
  if (local_60._M_head_impl != (CreateInfo *)0x0) {
    (*((local_60._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  return (unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>_>)
         (unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>_>)this;
}

Assistant:

unique_ptr<CreateStatement> Transformer::TransformCreateSchema(duckdb_libpgquery::PGCreateSchemaStmt &stmt) {
	auto result = make_uniq<CreateStatement>();
	auto info = make_uniq<CreateSchemaInfo>();

	D_ASSERT(stmt.schemaname);
	info->catalog = stmt.catalogname ? stmt.catalogname : INVALID_CATALOG;
	info->schema = stmt.schemaname;
	info->on_conflict = TransformOnConflict(stmt.onconflict);

	if (stmt.schemaElts) {
		// schema elements
		for (auto cell = stmt.schemaElts->head; cell != nullptr; cell = cell->next) {
			auto node = PGPointerCast<duckdb_libpgquery::PGNode>(cell->data.ptr_value);
			switch (node->type) {
			case duckdb_libpgquery::T_PGCreateStmt:
			case duckdb_libpgquery::T_PGViewStmt:
			default:
				throw NotImplementedException("Schema element not supported yet!");
			}
		}
	}
	result->info = std::move(info);
	return result;
}